

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_control-test.cpp
# Opt level: O0

void print_button(char *name,bool state)

{
  ostream *poVar1;
  byte in_SIL;
  char *pcVar2;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,in_RDI);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "released";
  if ((in_SIL & 1) != 0) {
    pcVar2 = "pressed";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_button(const char *name, bool state)
{
  cout << name << " " << (state ? "pressed" : "released") << endl;
}